

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

UString * jsonnet::internal::jsonnet_string_unescape(LocationRange *loc,UString *s)

{
  char32_t cVar1;
  bool bVar2;
  StaticError *this;
  string *msg_00;
  ostream *poVar3;
  undefined8 uVar4;
  char32_t *pcVar5;
  UString *in_RDI;
  string utf8;
  stringstream ss_2;
  char *msg;
  unsigned_long codepoint2;
  stringstream ss_1;
  stringstream ss;
  unsigned_long codepoint;
  char32_t *c;
  char32_t *s_ptr;
  UString *r;
  string *in_stack_fffffffffffff9b8;
  char32_t cVar6;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff9c0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff9d0;
  LocationRange *in_stack_fffffffffffff9d8;
  LocationRange *location;
  StaticError *in_stack_fffffffffffff9e0;
  allocator<char> *__a;
  char *__s;
  undefined4 in_stack_fffffffffffffa00;
  char32_t in_stack_fffffffffffffa04;
  undefined1 local_588 [48];
  ostream local_558 [216];
  unsigned_long in_stack_fffffffffffffb80;
  unsigned_long in_stack_fffffffffffffb88;
  LocationRange *in_stack_fffffffffffffb90;
  char32_t *in_stack_fffffffffffffc08;
  LocationRange *in_stack_fffffffffffffc10;
  char local_3d9 [33];
  allocator<char> *local_3b8;
  unsigned_long local_3b0;
  undefined1 local_3a1;
  stringstream local_380 [16];
  ostream local_370 [383];
  undefined1 local_1f1;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  unsigned_long local_48;
  char32_t *local_30;
  char32_t *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  std::__cxx11::u32string::u32string(in_stack_fffffffffffff9d0);
  local_30 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::c_str
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)0x2108ac);
  local_28 = local_30;
  do {
    if (*local_30 == L'\0') {
      return in_RDI;
    }
    cVar6 = (char32_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
    if (*local_30 == L'\\') {
      pcVar5 = local_30 + 1;
      cVar1 = local_30[1];
      if (cVar1 == L'\0') {
        local_3b8 = (allocator<char> *)0x34005c;
        local_30 = pcVar5;
        this = (StaticError *)__cxa_allocate_exception(0x60);
        __s = local_3d9;
        __a = local_3b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),__s,__a);
        StaticError::StaticError(this,in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0)
        ;
        __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if ((cVar1 == L'\"') || (cVar1 == L'\'')) {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L'/') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L'\\') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L'b') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L'f') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L'n') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L'r') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else if (cVar1 == L't') {
        local_30 = pcVar5;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,cVar6);
      }
      else {
        if (cVar1 != L'u') {
          local_30 = pcVar5;
          std::__cxx11::stringstream::stringstream((stringstream *)(local_588 + 0x20));
          cVar6 = (char32_t)in_stack_fffffffffffff9c0;
          location = (LocationRange *)local_588;
          std::__cxx11::string::string((string *)location);
          encode_utf8(cVar6,in_stack_fffffffffffff9b8);
          msg_00 = (string *)
                   std::operator<<(local_558,"Unknown escape sequence in string literal: \'");
          poVar3 = std::operator<<((ostream *)msg_00,(string *)local_588);
          std::operator<<(poVar3,"\'");
          uVar4 = __cxa_allocate_exception(0x60);
          std::__cxx11::stringstream::str();
          StaticError::StaticError(in_stack_fffffffffffff9e0,location,msg_00);
          __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_30 = local_30 + 2;
        local_48 = jsonnet_string_parse_unicode(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
        ;
        local_30 = local_30 + 3;
        bVar2 = is_bmp_codepoint(local_48);
        if (!bVar2) {
          if (local_30[1] != L'\\') {
            local_30 = local_30 + 1;
            std::__cxx11::stringstream::stringstream(local_1d0);
            std::operator<<(local_1c0,"Invalid non-BMP Unicode escape in string literal");
            local_1f1 = 1;
            uVar4 = __cxa_allocate_exception(0x60);
            std::__cxx11::stringstream::str();
            StaticError::StaticError
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                       (string *)in_stack_fffffffffffff9d0);
            local_1f1 = 0;
            __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
          }
          if (local_30[2] != L'u') {
            local_30 = local_30 + 2;
            std::__cxx11::stringstream::stringstream(local_380);
            std::operator<<(local_370,"Invalid non-BMP Unicode escape in string literal");
            local_3a1 = 1;
            uVar4 = __cxa_allocate_exception(0x60);
            std::__cxx11::stringstream::str();
            StaticError::StaticError
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                       (string *)in_stack_fffffffffffff9d0);
            local_3a1 = 0;
            __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
          }
          local_30 = local_30 + 3;
          local_3b0 = jsonnet_string_parse_unicode
                                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          local_30 = local_30 + 3;
          in_stack_fffffffffffffa04 =
               decode_utf16_surrogates
                         (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                          in_stack_fffffffffffffb80);
          local_48 = (unsigned_long)(uint)in_stack_fffffffffffffa04;
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=(in_stack_fffffffffffff9c0,(char32_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20))
        ;
      }
    }
    else {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      operator+=(in_stack_fffffffffffff9c0,cVar6);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

UString jsonnet_string_unescape(const LocationRange &loc, const UString &s)
{
    UString r;
    const char32_t *s_ptr = s.c_str();
    for (const char32_t *c = s_ptr; *c != U'\0'; ++c) {
        switch (*c) {
            case '\\':
                switch (*(++c)) {
                    case '"':
                    case '\'': r += *c; break;

                    case '\\': r += *c; break;

                    case '/': r += *c; break;

                    case 'b': r += '\b'; break;

                    case 'f': r += '\f'; break;

                    case 'n': r += '\n'; break;

                    case 'r': r += '\r'; break;

                    case 't': r += '\t'; break;

                    case 'u': {
                        ++c;  // Consume the 'u'.
                        unsigned long codepoint = jsonnet_string_parse_unicode(loc, c);

                        // Leave us on the last char, ready for the ++c at
                        // the outer for loop.
                        c += 3;
                        if (!is_bmp_codepoint(codepoint)) {
                           if (*(++c) != '\\') {
                                std::stringstream ss;
                                ss << "Invalid non-BMP Unicode escape in string literal";
                                throw StaticError(loc, ss.str());
                           }
                           if (*(++c) != 'u') {
                                std::stringstream ss;
                                ss << "Invalid non-BMP Unicode escape in string literal";
                                throw StaticError(loc, ss.str());
                           }
                           ++c;
                           unsigned long codepoint2 = jsonnet_string_parse_unicode(loc, c);
                           c += 3;
                           codepoint = decode_utf16_surrogates(loc, codepoint, codepoint2);
                       }
                       r += codepoint;
                    } break;

                    case '\0': {
                        auto msg = "Truncated escape sequence in string literal.";
                        throw StaticError(loc, msg);
                    }

                    default: {
                        std::stringstream ss;
                        std::string utf8;
                        encode_utf8(*c, utf8);
                        ss << "Unknown escape sequence in string literal: '" << utf8 << "'";
                        throw StaticError(loc, ss.str());
                    }
                }
                break;

            default:
                // Just a regular letter.
                r += *c;
        }
    }
    return r;
}